

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Test.cpp
# Opt level: O1

void serializeTest(void)

{
  double dVar1;
  double dVar2;
  initializer_list<double> __l;
  undefined1 auStack_258 [8];
  stringstream ss;
  pointer local_248;
  undefined8 uStack_240;
  undefined8 local_238;
  ios_base local_1d8 [264];
  vector<double,_std::allocator<double>_> local_d0;
  double local_b8;
  undefined8 uStack_b0;
  undefined1 local_a0 [8];
  NeuralNet nn2;
  vector<double,_std::allocator<double>_> input;
  vector<PyreNet::LayerDefinition,_std::allocator<PyreNet::LayerDefinition>_> layerDefs;
  undefined1 local_30 [8];
  NeuralNet nn;
  
  input.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  auStack_258._0_4_ = 0x32;
  local_30._0_4_ = relu;
  std::vector<PyreNet::LayerDefinition,std::allocator<PyreNet::LayerDefinition>>::
  emplace_back<int,PyreNet::LayerDefinition::activationType>
            ((vector<PyreNet::LayerDefinition,std::allocator<PyreNet::LayerDefinition>> *)
             &input.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,(int *)auStack_258,
             (activationType *)local_30);
  auStack_258._0_4_ = 0x32;
  local_30._0_4_ = relu;
  std::vector<PyreNet::LayerDefinition,std::allocator<PyreNet::LayerDefinition>>::
  emplace_back<int,PyreNet::LayerDefinition::activationType>
            ((vector<PyreNet::LayerDefinition,std::allocator<PyreNet::LayerDefinition>> *)
             &input.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,(int *)auStack_258,
             (activationType *)local_30);
  auStack_258._0_4_ = 0x32;
  local_30._0_4_ = relu;
  std::vector<PyreNet::LayerDefinition,std::allocator<PyreNet::LayerDefinition>>::
  emplace_back<int,PyreNet::LayerDefinition::activationType>
            ((vector<PyreNet::LayerDefinition,std::allocator<PyreNet::LayerDefinition>> *)
             &input.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,(int *)auStack_258,
             (activationType *)local_30);
  auStack_258._0_4_ = 2;
  local_30._0_4_ = relu;
  std::vector<PyreNet::LayerDefinition,std::allocator<PyreNet::LayerDefinition>>::
  emplace_back<int,PyreNet::LayerDefinition::activationType>
            ((vector<PyreNet::LayerDefinition,std::allocator<PyreNet::LayerDefinition>> *)
             &input.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,(int *)auStack_258,
             (activationType *)local_30);
  PyreNet::NeuralNet::NeuralNet
            ((NeuralNet *)local_30,5,
             (vector<PyreNet::LayerDefinition,_std::allocator<PyreNet::LayerDefinition>_> *)
             &input.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  PyreNet::NeuralNet::mutate_uniform((NeuralNet *)local_30,0.0,2.0,-1);
  local_248 = (pointer)0x4000000000000000;
  uStack_240 = 0x4008000000000000;
  auStack_258 = (undefined1  [8])0x0;
  _ss = (pointer)0x3ff0000000000000;
  local_238 = 0x4010000000000000;
  __l._M_len = 5;
  __l._M_array = (iterator)auStack_258;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)
             &nn2.layers.super__Vector_base<PyreNet::Layer,_std::allocator<PyreNet::Layer>_>._M_impl
              .super__Vector_impl_data._M_end_of_storage,__l,(allocator_type *)local_a0);
  PyreNet::NeuralNet::predict
            ((vector<double,_std::allocator<double>_> *)auStack_258,(NeuralNet *)local_30,
             (vector<double,_std::allocator<double>_> *)
             &nn2.layers.super__Vector_base<PyreNet::Layer,_std::allocator<PyreNet::Layer>_>._M_impl
              .super__Vector_impl_data._M_end_of_storage);
  dVar1 = *(double *)auStack_258;
  operator_delete((void *)auStack_258,(long)local_248 - (long)auStack_258);
  std::__cxx11::stringstream::stringstream((stringstream *)auStack_258);
  PyreNet::operator<<((ostream *)&local_248,(NeuralNet *)local_30);
  PyreNet::NeuralNet::mutate_uniform((NeuralNet *)local_30,2.0,2.0,-1);
  PyreNet::NeuralNet::predict
            ((vector<double,_std::allocator<double>_> *)local_a0,(NeuralNet *)local_30,
             (vector<double,_std::allocator<double>_> *)
             &nn2.layers.super__Vector_base<PyreNet::Layer,_std::allocator<PyreNet::Layer>_>._M_impl
              .super__Vector_impl_data._M_end_of_storage);
  local_b8 = ABS(*(double *)local_a0 - dVar1);
  uStack_b0 = 0;
  operator_delete((void *)local_a0,
                  (long)nn2.layers.
                        super__Vector_base<PyreNet::Layer,_std::allocator<PyreNet::Layer>_>._M_impl.
                        super__Vector_impl_data._M_start - (long)local_a0);
  if (1.0 < local_b8) {
    PyreNet::operator>>((istream *)auStack_258,(NeuralNet *)local_30);
    PyreNet::NeuralNet::predict
              ((vector<double,_std::allocator<double>_> *)local_a0,(NeuralNet *)local_30,
               (vector<double,_std::allocator<double>_> *)
               &nn2.layers.super__Vector_base<PyreNet::Layer,_std::allocator<PyreNet::Layer>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage);
    local_b8 = ABS(*(double *)local_a0 - dVar1);
    uStack_b0 = 0;
    operator_delete((void *)local_a0,
                    (long)nn2.layers.
                          super__Vector_base<PyreNet::Layer,_std::allocator<PyreNet::Layer>_>.
                          _M_impl.super__Vector_impl_data._M_start - (long)local_a0);
    if (local_b8 <= 1.0) {
      PyreNet::operator<<((ostream *)&local_248,(NeuralNet *)local_30);
      PyreNet::NeuralNet::NeuralNet((NeuralNet *)local_a0,(istream *)auStack_258);
      PyreNet::NeuralNet::predict
                (&local_d0,(NeuralNet *)local_a0,
                 (vector<double,_std::allocator<double>_> *)
                 &nn2.layers.super__Vector_base<PyreNet::Layer,_std::allocator<PyreNet::Layer>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage);
      dVar2 = *local_d0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      operator_delete(local_d0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_d0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_d0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start);
      if (ABS(dVar2 - dVar1) <= 1.0) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"Serialize test complete",0x17);
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'H');
        std::ostream::put('H');
        std::ostream::flush();
        std::vector<PyreNet::Layer,_std::allocator<PyreNet::Layer>_>::~vector
                  ((vector<PyreNet::Layer,_std::allocator<PyreNet::Layer>_> *)&nn2);
        std::__cxx11::stringstream::~stringstream((stringstream *)auStack_258);
        std::ios_base::~ios_base(local_1d8);
        if (nn2.layers.super__Vector_base<PyreNet::Layer,_std::allocator<PyreNet::Layer>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
          operator_delete(nn2.layers.
                          super__Vector_base<PyreNet::Layer,_std::allocator<PyreNet::Layer>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage,
                          (long)input.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                super__Vector_impl_data._M_finish -
                          (long)nn2.layers.
                                super__Vector_base<PyreNet::Layer,_std::allocator<PyreNet::Layer>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage);
        }
        std::vector<PyreNet::Layer,_std::allocator<PyreNet::Layer>_>::~vector
                  ((vector<PyreNet::Layer,_std::allocator<PyreNet::Layer>_> *)&nn);
        if (input.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
          operator_delete(input.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage,
                          -(long)input.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                 super__Vector_impl_data._M_end_of_storage);
        }
        return;
      }
    }
  }
  exit(1);
}

Assistant:

void serializeTest() {
    std::vector<PyreNet::LayerDefinition> layerDefs;
    layerDefs.emplace_back(50, PyreNet::LayerDefinition::activationType::relu);
    layerDefs.emplace_back(50, PyreNet::LayerDefinition::activationType::relu);
    layerDefs.emplace_back(50, PyreNet::LayerDefinition::activationType::relu);
    layerDefs.emplace_back(2, PyreNet::LayerDefinition::activationType::relu);
    PyreNet::NeuralNet nn(5, layerDefs);
    nn.mutate_uniform(0,2);
    std::vector<double> input{0,1,2,3,4};
    double output = nn.predict(input)[0];

    std::stringstream ss;
    ss << nn;

    nn.mutate_uniform(2,2);
    if (std::abs(nn.predict(input)[0] - output) <= 1)
        exit(EXIT_FAILURE);

    ss >> nn;
    if (std::abs(nn.predict(input)[0] - output) > 1)
        exit(EXIT_FAILURE);

    ss << nn;
    PyreNet::NeuralNet nn2(ss);
    if (std::abs(nn2.predict(input)[0] - output) > 1)
        exit(EXIT_FAILURE);

    std::cout << "Serialize test complete" << std::endl;
}